

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

IOTHUB_PROCESS_ITEM_RESULT
IoTHubTransport_MQTT_Common_ProcessItem
          (TRANSPORT_LL_HANDLE handle,IOTHUB_IDENTITY_TYPE item_type,
          IOTHUB_IDENTITY_INFO *iothub_item)

{
  uint16_t packetId;
  IOTHUB_DEVICE_TWIN *pIVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  MQTT_DEVICE_TWIN_ITEM *__ptr;
  STRING_HANDLE handle_00;
  CONSTBUFFER *pCVar4;
  char *pcVar5;
  MQTT_MESSAGE_HANDLE msgHandle;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0 || iothub_item == (IOTHUB_IDENTITY_INFO *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_ProcessItem",0xe05,1,
                "Invalid handle parameter iothub_item=%p",iothub_item);
      return IOTHUB_PROCESS_ERROR;
    }
    return IOTHUB_PROCESS_ERROR;
  }
  if (*(int *)((long)handle + 0xf0) != 0x30) {
    return IOTHUB_PROCESS_NOT_CONNECTED;
  }
  if (item_type != IOTHUB_TYPE_DEVICE_TWIN) {
    return IOTHUB_PROCESS_CONTINUE;
  }
  if (*(char *)((long)handle + 0x8f) != '\x01') {
    return IOTHUB_PROCESS_CONTINUE;
  }
  __ptr = createDeviceTwinMsg((MQTTTRANSPORT_HANDLE_DATA *)handle,REPORTED_STATE,
                              iothub_item->device_twin->item_id);
  if (__ptr == (MQTT_DEVICE_TWIN_ITEM *)0x0) {
    return IOTHUB_PROCESS_ERROR;
  }
  DList_InsertTailList((PDLIST_ENTRY)((long)handle + 0xd0),&__ptr->entry);
  pIVar1 = iothub_item->device_twin;
  handle_00 = STRING_construct_sprintf
                        ("$iothub/twin/PATCH/properties/reported/?$rid=%u",(ulong)__ptr->packet_id);
  if (handle_00 == (STRING_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"publishDeviceTwinMsg",0x50c,1,"Failed constructing reported prop topic.");
    }
    goto LAB_0012bf16;
  }
  pCVar4 = CONSTBUFFER_GetContent(pIVar1->report_data_handle);
  if (pCVar4 == (CONSTBUFFER *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar5 = "Failed retrieving buffer content";
      iVar2 = 0x514;
LAB_0012beb0:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"publishDeviceTwinMsg",iVar2,1,pcVar5);
    }
  }
  else {
    packetId = __ptr->packet_id;
    pcVar5 = STRING_c_str(handle_00);
    msgHandle = mqttmessage_create_in_place
                          (packetId,pcVar5,DELIVER_AT_MOST_ONCE,pCVar4->buffer,pCVar4->size);
    if (msgHandle == (MQTT_MESSAGE_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = "Failed creating mqtt message";
        iVar2 = 0x51c;
        goto LAB_0012beb0;
      }
    }
    else {
      iVar2 = tickcounter_get_current_ms
                        (*(TICK_COUNTER_HANDLE *)((long)handle + 0xb8),&__ptr->msgPublishTime);
      if (iVar2 == 0) {
        iVar2 = mqtt_client_publish(*(MQTT_CLIENT_HANDLE *)((long)handle + 0x70),msgHandle);
        if (iVar2 == 0) {
          __ptr->retryCount = __ptr->retryCount + 1;
          mqttmessage_destroy(msgHandle);
          STRING_delete(handle_00);
          return IOTHUB_PROCESS_OK;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "Failed publishing mqtt message";
          iVar2 = 0x52a;
          goto LAB_0012bef6;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "Failed retrieving tickcounter info";
          iVar2 = 0x523;
LAB_0012bef6:
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"publishDeviceTwinMsg",iVar2,1,pcVar5);
        }
      }
      mqttmessage_destroy(msgHandle);
    }
  }
  STRING_delete(handle_00);
LAB_0012bf16:
  DList_RemoveEntryList(&__ptr->entry);
  free(__ptr);
  return IOTHUB_PROCESS_ERROR;
}

Assistant:

IOTHUB_PROCESS_ITEM_RESULT IoTHubTransport_MQTT_Common_ProcessItem(TRANSPORT_LL_HANDLE handle, IOTHUB_IDENTITY_TYPE item_type, IOTHUB_IDENTITY_INFO* iothub_item)
{
    IOTHUB_PROCESS_ITEM_RESULT result;
    if (handle == NULL || iothub_item == NULL)
    {
        LogError("Invalid handle parameter iothub_item=%p", iothub_item);
        result = IOTHUB_PROCESS_ERROR;
    }
    else
    {
        PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;

        if (transport_data->currPacketState == PUBLISH_TYPE)
        {
            // Ensure the reported property suback has been received
            if (item_type == IOTHUB_TYPE_DEVICE_TWIN && transport_data->twin_resp_sub_recv)
            {
                MQTT_DEVICE_TWIN_ITEM* mqtt_info = createDeviceTwinMsg(transport_data, REPORTED_STATE, iothub_item->device_twin->item_id);
                if (mqtt_info == NULL)
                {
                    result = IOTHUB_PROCESS_ERROR;
                }
                else
                {
                    DList_InsertTailList(&transport_data->ack_waiting_queue, &mqtt_info->entry);

                    if (publishDeviceTwinMsg(transport_data, iothub_item->device_twin, mqtt_info) != 0)
                    {
                        DList_RemoveEntryList(&mqtt_info->entry);

                        free(mqtt_info);
                        result = IOTHUB_PROCESS_ERROR;
                    }
                    else
                    {
                        result = IOTHUB_PROCESS_OK;
                    }
                }
            }
            else
            {
                result = IOTHUB_PROCESS_CONTINUE;
            }
        }
        else
        {
            result = IOTHUB_PROCESS_NOT_CONNECTED;
        }
    }
    return result;
}